

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O2

void __thiscall warning_suppressor::warning_suppressor(warning_suppressor *this)

{
  streambuf *psVar1;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  psVar1 = set_streambuf((streambuf *)&this->field_0x8);
  this->streambuf = psVar1;
  this->warnings = logger::total_warnings;
  this->errors = logger::total_errors;
  return;
}

Assistant:

warning_suppressor()
		: streambuf(set_streambuf(buffer.rdbuf()))
		, warnings(logger::total_warnings)
		, errors(logger::total_errors)
	{ }